

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void __thiscall
llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
          (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *this)

{
  iterator I;
  
  I = (iterator)
      (this->Slabs).super_SmallVectorImpl<void_*>.super_SmallVectorTemplateBase<void_*,_true>.
      super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.BeginX;
  DeallocateSlabs(this,I,I + (this->Slabs).super_SmallVectorImpl<void_*>.
                             super_SmallVectorTemplateBase<void_*,_true>.
                             super_SmallVectorTemplateCommon<void_*,_void>.super_SmallVectorBase.
                             Size);
  DeallocateCustomSizedSlabs(this);
  SmallVectorImpl<std::pair<void_*,_unsigned_long>_>::~SmallVectorImpl
            (&(this->CustomSizedSlabs).super_SmallVectorImpl<std::pair<void_*,_unsigned_long>_>);
  SmallVectorImpl<void_*>::~SmallVectorImpl(&(this->Slabs).super_SmallVectorImpl<void_*>);
  return;
}

Assistant:

~BumpPtrAllocatorImpl() {
    DeallocateSlabs(Slabs.begin(), Slabs.end());
    DeallocateCustomSizedSlabs();
  }